

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  int iVar1;
  int iVar2;
  N_Vector *v;
  long lVar3;
  realtype **h;
  realtype *q;
  N_Vector z;
  realtype *b_00;
  N_Vector y;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar4;
  undefined8 uVar5;
  code *pcVar6;
  code *pcVar7;
  realtype *stemp;
  N_Vector *vtemp_00;
  bool bVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  double *pdVar12;
  bool bVar13;
  realtype rVar14;
  double local_130;
  N_Vector *Xv;
  realtype *cv;
  PSolveFn psolve;
  ATimesFn atimes;
  void *P_data;
  void *A_data;
  int *nli;
  int gstype;
  int max_restarts;
  int ntries;
  int ier;
  int krydim;
  int l_max;
  int l;
  int k;
  int j;
  int i;
  int converged;
  int scale2;
  int scale1;
  int preOnRight;
  realtype rho;
  realtype s_product;
  realtype r_norm;
  realtype rotation_product;
  realtype beta;
  realtype *res_norm;
  realtype *yg;
  realtype *givens;
  realtype **Hes;
  N_Vector s2;
  N_Vector s1;
  N_Vector vtemp;
  N_Vector xcor;
  N_Vector *Z;
  N_Vector *V;
  realtype delta_local;
  N_Vector b_local;
  N_Vector x_local;
  SUNMatrix A_local;
  SUNLinearSolver S_local;
  
  ntries = 0;
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    iVar9 = *S->content;
    iVar1 = *(int *)((long)S->content + 0xc);
    iVar2 = *(int *)((long)S->content + 8);
    v = *(N_Vector **)((long)S->content + 0x60);
    lVar3 = *(long *)((long)S->content + 0x68);
    h = *(realtype ***)((long)S->content + 0x70);
    q = *(realtype **)((long)S->content + 0x78);
    z = *(N_Vector *)((long)S->content + 0x80);
    b_00 = *(realtype **)((long)S->content + 0x88);
    y = *(N_Vector *)((long)S->content + 0x90);
    x_00 = *(N_Vector *)((long)S->content + 0x50);
    y_00 = *(N_Vector *)((long)S->content + 0x58);
    uVar4 = *(undefined8 *)((long)S->content + 0x30);
    uVar5 = *(undefined8 *)((long)S->content + 0x48);
    pcVar6 = *(code **)((long)S->content + 0x28);
    pcVar7 = *(code **)((long)S->content + 0x40);
    piVar11 = (int *)((long)S->content + 0x10);
    pdVar12 = (double *)((long)S->content + 0x18);
    stemp = *(realtype **)((long)S->content + 0x98);
    vtemp_00 = *(N_Vector **)((long)S->content + 0xa0);
    *piVar11 = 0;
    bVar8 = false;
    bVar13 = true;
    if ((*(int *)((long)S->content + 4) != 1) &&
       (bVar13 = true, *(int *)((long)S->content + 4) != 2)) {
      bVar13 = *(int *)((long)S->content + 4) == 3;
    }
    rVar14 = N_VDotProd(x,x);
    if ((rVar14 != 0.0) || (NAN(rVar14))) {
      iVar10 = (*pcVar6)(uVar4,x,y);
      if (iVar10 != 0) {
        iVar9 = 3;
        if (iVar10 < 0) {
          iVar9 = -4;
        }
        *(long *)((long)S->content + 0x20) = (long)iVar9;
        return (int)*(undefined8 *)((long)S->content + 0x20);
      }
      N_VLinearSum(1.0,b,-1.0,y,y);
    }
    else {
      N_VScale(1.0,b,y);
    }
    if (x_00 != (N_Vector)0x0) {
      N_VProd(x_00,y,*v);
    }
    else {
      N_VScale(1.0,y,*v);
    }
    rVar14 = N_VDotProd(*v,*v);
    if (0.0 < rVar14) {
      rVar14 = N_VDotProd(*v,*v);
      local_130 = sqrt(rVar14);
    }
    else {
      local_130 = 0.0;
    }
    s_product = local_130;
    *pdVar12 = local_130;
    if (delta < local_130) {
      _scale1 = local_130;
      N_VConst(0.0,z);
      for (gstype = 0; gstype <= iVar1; gstype = gstype + 1) {
        for (k = 0; k <= iVar9; k = k + 1) {
          for (l = 0; l < iVar9; l = l + 1) {
            h[k][l] = 0.0;
          }
        }
        r_norm = 1.0;
        N_VScale(1.0 / s_product,*v,*v);
        for (krydim = 0; krydim < iVar9; krydim = krydim + 1) {
          *piVar11 = *piVar11 + 1;
          ntries = krydim + 1;
          if (y_00 == (N_Vector)0x0) {
            N_VScale(1.0,v[krydim],y);
          }
          else {
            N_VDiv(v[krydim],y_00,y);
          }
          if (bVar13) {
            N_VScale(1.0,y,v[krydim + 1]);
            iVar10 = (*pcVar7)(delta,uVar5,v[krydim + 1],y,2);
            if (iVar10 != 0) {
              iVar9 = 5;
              if (iVar10 < 0) {
                iVar9 = -6;
              }
              *(long *)((long)S->content + 0x20) = (long)iVar9;
              return (int)*(undefined8 *)((long)S->content + 0x20);
            }
          }
          N_VScale(1.0,y,*(N_Vector *)(lVar3 + (long)krydim * 8));
          iVar10 = (*pcVar6)(uVar4,y,v[krydim + 1]);
          if (iVar10 != 0) {
            iVar9 = 3;
            if (iVar10 < 0) {
              iVar9 = -4;
            }
            *(long *)((long)S->content + 0x20) = (long)iVar9;
            return (int)*(undefined8 *)((long)S->content + 0x20);
          }
          if (x_00 != (N_Vector)0x0) {
            N_VProd(x_00,v[krydim + 1],v[krydim + 1]);
          }
          if (iVar2 == 2) {
            iVar10 = ClassicalGS(v,h,krydim + 1,iVar9,h[krydim + 1] + krydim,stemp,vtemp_00);
            if (iVar10 != 0) {
              *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff8;
              return (int)*(undefined8 *)((long)S->content + 0x20);
            }
          }
          else {
            iVar10 = ModifiedGS(v,h,krydim + 1,iVar9,h[krydim + 1] + krydim);
            if (iVar10 != 0) {
              *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff8;
              return (int)*(undefined8 *)((long)S->content + 0x20);
            }
          }
          iVar10 = QRfact(ntries,h,q,krydim);
          if (iVar10 != 0) {
            *(undefined8 *)((long)S->content + 0x20) = 7;
            return (int)*(undefined8 *)((long)S->content + 0x20);
          }
          r_norm = q[krydim * 2 + 1] * r_norm;
          _scale1 = ABS(r_norm * s_product);
          *pdVar12 = _scale1;
          if (_scale1 <= delta) {
            bVar8 = true;
            break;
          }
          N_VScale(1.0 / h[krydim + 1][krydim],v[krydim + 1],v[krydim + 1]);
        }
        *b_00 = s_product;
        for (k = 1; k <= ntries; k = k + 1) {
          b_00[k] = 0.0;
        }
        iVar10 = QRsol(ntries,h,q,b_00);
        if (iVar10 != 0) {
          *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff7;
          return (int)*(undefined8 *)((long)S->content + 0x20);
        }
        *stemp = 1.0;
        *vtemp_00 = z;
        for (l_max = 0; l_max < ntries; l_max = l_max + 1) {
          stemp[l_max + 1] = b_00[l_max];
          vtemp_00[l_max + 1] = *(N_Vector *)(lVar3 + (long)l_max * 8);
        }
        iVar10 = N_VLinearCombination(ntries + 1,stemp,vtemp_00,z);
        if (iVar10 != 0) {
          return -10;
        }
        if (bVar8) {
          N_VLinearSum(1.0,x,1.0,z,x);
          *(undefined8 *)((long)S->content + 0x20) = 0;
          return (int)*(undefined8 *)((long)S->content + 0x20);
        }
        if (gstype == iVar1) break;
        rho = 1.0;
        for (k = ntries; 0 < k; k = k + -1) {
          b_00[k] = rho * q[k * 2 + -2];
          rho = q[k * 2 + -1] * rho;
        }
        *b_00 = rho;
        for (k = 0; k <= ntries; k = k + 1) {
          b_00[k] = rho * s_product * b_00[k];
        }
        s_product = ABS(rho * s_product);
        for (l_max = 0; l_max <= ntries; l_max = l_max + 1) {
          stemp[l_max] = b_00[l_max];
          vtemp_00[l_max] = v[l_max];
        }
        iVar10 = N_VLinearCombination(ntries + 1,stemp,vtemp_00,*v);
        if (iVar10 != 0) {
          return -10;
        }
      }
      if (local_130 <= _scale1) {
        *(undefined8 *)((long)S->content + 0x20) = 2;
        S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x20);
      }
      else {
        N_VLinearSum(1.0,x,1.0,z,x);
        *(undefined8 *)((long)S->content + 0x20) = 1;
        S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x20);
      }
    }
    else {
      *(undefined8 *)((long)S->content + 0x20) = 0;
      S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x20);
    }
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                         N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  realtype **Hes, *givens, *yg, *res_norm;
  realtype beta, rotation_product, r_norm, s_product, rho;
  booleantype preOnRight, scale1, scale2, converged;
  int i, j, k, l, l_max, krydim, ier, ntries, max_restarts, gstype;
  int *nli;
  void *A_data, *P_data;
  ATimesFn atimes;
  PSolveFn psolve;

  /* local shortcuts for fused vector operations */
  realtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* set booleantype flags for internal solver options */
  preOnRight = ( (SPFGMR_CONTENT(S)->pretype == PREC_LEFT) ||
                 (SPFGMR_CONTENT(S)->pretype == PREC_RIGHT) || 
                 (SPFGMR_CONTENT(S)->pretype == PREC_BOTH) );
  scale1 = (s1 != NULL);
  scale2 = (s2 != NULL);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (N_VDotProd(x, x) == ZERO) {
    N_VScale(ONE, b, vtemp);
  } else {
    ier = atimes(A_data, x, vtemp);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ? 
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1) {
    N_VProd(s1, vtemp, V[0]);   
  } else {
    N_VScale(ONE, vtemp, V[0]);
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  *res_norm = r_norm = beta = SUNRsqrt(N_VDotProd(V[0], V[0]));
  if (r_norm <= delta) {
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries=0; ntries<=max_restarts; ntries++) {
    
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i=0; i<=l_max; i++)
      for (j=0; j<l_max; j++)
        Hes[i][j] = ZERO;
    rotation_product = ONE;
    N_VScale(ONE/r_norm, V[0], V[0]);
    
    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l=0; l<l_max; l++) {
      
      (*nli)++;
      
      krydim = l + 1;
      
      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2) N_VDiv(V[l], s2, vtemp);
      else N_VScale(ONE, V[l], vtemp);
      
      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */ 
      if (preOnRight) {
        N_VScale(ONE, vtemp, V[l+1]);
        ier = psolve(P_data, V[l+1], vtemp, delta, PREC_RIGHT);
        if (ier != 0) {
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      
      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      ier = atimes(A_data, vtemp, V[l+1]);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
        return(LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)  N_VProd(s1, V[l+1], V[l+1]);
      
      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == CLASSICAL_GS) {
        if (ClassicalGS(V, Hes, l+1, l_max, &(Hes[l+1][l]), cv, Xv) != 0) {
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      } else {
        if (ModifiedGS(V, Hes, l+1, l_max, &(Hes[l+1][l])) != 0) {
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      }
      
      /* Update the QR factorization of Hes. */
      if(QRfact(krydim, Hes, givens, l) != 0 ) {
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return(LASTFLAG(S));
      }
      
      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2*l+1];
      *res_norm = rho = SUNRabs(rotation_product*r_norm);
      if (rho <= delta) { converged = SUNTRUE; break; }
      
      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE/Hes[l+1][l], V[l+1], V[l+1]);
    }
    
    /* Inner loop is done.  Compute the new correction vector xcor. */
    
    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i=1; i<=krydim; i++)  yg[i]=ZERO;
    if (QRsol(krydim, Hes, givens, yg) != 0) {
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return(LASTFLAG(S));
    }
    
    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k=0; k<krydim; k++) {
      cv[k+1] = yg[k];
      Xv[k+1] = Z[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, xcor);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* If converged, construct the final solution vector x and return. */
    if (converged) {
      N_VLinearSum(ONE, x, ONE, xcor, x); {
        LASTFLAG(S) = SUNLS_SUCCESS;
        return(LASTFLAG(S));
      }
    }
    
    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) break;
    
    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i=krydim; i>0; i--) {
      yg[i] = s_product*givens[2*i-2];
      s_product *= givens[2*i-1];
    }
    yg[0] = s_product;
    
    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i=0; i<=krydim; i++)
      yg[i] *= r_norm;
    r_norm = SUNRabs(r_norm);
    
    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k=0; k<=krydim; k++) {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, V[0]);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);
    
  }
  
  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta) {
    N_VLinearSum(ONE, x, ONE, xcor, x); {
      LASTFLAG(S) = SUNLS_RES_REDUCED;
      return(LASTFLAG(S));
    }
  }

  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return(LASTFLAG(S)); 
}